

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitArrayNewFixed(OptimizeInstructions *this,ArrayNewFixed *curr)

{
  ArrayNewFixed *parent;
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Module *pMVar4;
  ArrayNew *pAVar5;
  Expression *pEVar6;
  Function *func;
  PassOptions *options;
  Const *pCVar7;
  PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_> *this_00;
  optional<wasm::Type> type_;
  bool local_131;
  undefined1 local_118 [12];
  HeapType local_108;
  ArrayNew *local_100;
  ArrayNew *arrayNew;
  Block *block;
  ChildLocalizer localizer;
  ArrayNew *withDefault;
  Literal local_98;
  byte local_79;
  Literal local_78;
  Expression *local_60;
  Expression *value;
  HeapType local_50 [2];
  Type local_40;
  Type type;
  Builder builder;
  Index i;
  size_t size;
  ArrayNewFixed *local_18;
  ArrayNewFixed *curr_local;
  OptimizeInstructions *this_local;
  
  size._4_4_ = 1;
  local_18 = curr;
  curr_local = (ArrayNewFixed *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.
                      type,(BasicType *)((long)&size + 4));
  if ((!bVar1) &&
     (sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_18->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        ), sVar2 != 0)) {
    for (builder.wasm._4_4_ = 0; (ulong)builder.wasm._4_4_ < sVar2 - 1;
        builder.wasm._4_4_ = builder.wasm._4_4_ + 1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(local_18->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)builder.wasm._4_4_);
      pEVar6 = *ppEVar3;
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(local_18->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)(builder.wasm._4_4_ + 1));
      bVar1 = areConsecutiveInputsEqual(this,pEVar6,*ppEVar3);
      if (!bVar1) {
        return;
      }
    }
    pMVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    Builder::Builder((Builder *)&type,pMVar4);
    value = (Expression *)
            wasm::Type::getHeapType
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)73>).
                        super_Expression.type);
    HeapType::getArray(local_50);
    local_40.id = local_50[0].id;
    bVar1 = wasm::Type::isDefaultable(&local_40);
    if (bVar1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(local_18->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,0);
      local_60 = getFallthrough(this,*ppEVar3);
      bVar1 = Properties::isSingleConstantExpression(local_60);
      local_79 = 0;
      local_131 = false;
      if (bVar1) {
        Properties::getLiteral(&local_78,local_60);
        local_79 = 1;
        wasm::Literal::makeZero(&local_98,local_40);
        local_131 = wasm::Literal::operator==(&local_78,&local_98);
        wasm::Literal::~Literal(&local_98);
      }
      if ((local_79 & 1) != 0) {
        wasm::Literal::~Literal(&local_78);
      }
      if (local_131 != false) {
        localizer._40_8_ =
             wasm::Type::getHeapType
                       (&(local_18->super_SpecificExpression<(wasm::Expression::Id)73>).
                         super_Expression.type);
        pCVar7 = Builder::makeConst<int>((Builder *)&type,(int)sVar2);
        pAVar5 = Builder::makeArrayNew
                           ((Builder *)&type,(HeapType)localizer._40_8_,(Expression *)pCVar7,
                            (Expression *)0x0);
        pEVar6 = getDroppedChildrenAndAppend(this,(Expression *)local_18,(Expression *)pAVar5);
        replaceCurrent(this,pEVar6);
        return;
      }
    }
    parent = local_18;
    if (sVar2 != 1) {
      this_00 = &(this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
      ;
      func = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getFunction(&this_00->
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        );
      pMVar4 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               ::getModule(&this_00->
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          );
      options = Pass::getPassOptions((Pass *)this);
      ChildLocalizer::ChildLocalizer
                ((ChildLocalizer *)&block,(Expression *)parent,func,pMVar4,options);
      arrayNew = (ArrayNew *)ChildLocalizer::getChildrenReplacement((ChildLocalizer *)&block);
      local_108 = wasm::Type::getHeapType
                            (&(local_18->super_SpecificExpression<(wasm::Expression::Id)73>).
                              super_Expression.type);
      pCVar7 = Builder::makeConst<int>((Builder *)&type,(int)sVar2);
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(local_18->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,0);
      local_100 = Builder::makeArrayNew((Builder *)&type,local_108,(Expression *)pCVar7,*ppEVar3);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 (arrayNew + 1),(Expression *)local_100);
      pAVar5 = arrayNew;
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_118);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_118._0_8_;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_118[8];
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_118._9_3_;
      Block::finalize((Block *)pAVar5,type_,Unknown);
      replaceCurrent(this,(Expression *)arrayNew);
      ChildLocalizer::~ChildLocalizer((ChildLocalizer *)&block);
    }
  }
  return;
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    auto size = curr->values.size();
    if (size == 0) {
      // TODO: Consider what to do in the trivial case of an empty array: we can
      //       can use ArrayNew or ArrayNewFixed there. Measure which is best.
      return;
    }

    // If all the values are equal then we can optimize, either to
    // array.new_default (if they are all equal to the default) or array.new (if
    // they are all equal to some other value). First, see if they are all
    // equal, which we do by comparing in pairs: [0,1], then [1,2], etc.
    for (Index i = 0; i < size - 1; i++) {
      if (!areConsecutiveInputsEqual(curr->values[i], curr->values[i + 1])) {
        return;
      }
    }

    // Great, they are all equal!

    Builder builder(*getModule());

    // See if they are equal to a constant, and if that constant is the default.
    auto type = curr->type.getHeapType().getArray().element.type;
    if (type.isDefaultable()) {
      auto* value = getFallthrough(curr->values[0]);

      if (Properties::isSingleConstantExpression(value) &&
          Properties::getLiteral(value) == Literal::makeZero(type)) {
        // They are all equal to the default. Drop the children and return an
        // array.new_with_default.
        auto* withDefault = builder.makeArrayNew(
          curr->type.getHeapType(), builder.makeConst(int32_t(size)));
        replaceCurrent(getDroppedChildrenAndAppend(curr, withDefault));
        return;
      }
    }

    // They are all equal to each other, but not to the default value. If there
    // are 2 or more elements here then we can save by using array.new. For
    // example, with 2 elements we are doing this:
    //
    //  (array.new_fixed
    //    (A)
    //    (A)
    //  )
    // =>
    //  (array.new
    //    (A)
    //    (i32.const 2) ;; get two copies of (A)
    //  )
    //
    // However, with 1, ArrayNewFixed is actually more compact, and we optimize
    // ArrayNew to it, above.
    if (size == 1) {
      return;
    }

    // Move children to locals, if we need to keep them around. We are removing
    // them all, except from the first, when we remove the array.new_fixed's
    // list of children and replace it with a single child + a constant for the
    // number of children.
    ChildLocalizer localizer(
      curr, getFunction(), *getModule(), getPassOptions());
    auto* block = localizer.getChildrenReplacement();
    auto* arrayNew = builder.makeArrayNew(curr->type.getHeapType(),
                                          builder.makeConst(int32_t(size)),
                                          curr->values[0]);
    block->list.push_back(arrayNew);
    block->finalize();
    replaceCurrent(block);
  }